

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_unittest.cc
# Opt level: O0

AssertionResult __thiscall
anon_unknown.dwarf_1f26c::IsEqual
          (anon_unknown_dwarf_1f26c *this,char *test_data,uint32_t digest,char *test_result)

{
  int iVar1;
  char *__s1;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  AssertionResult local_68;
  undefined4 local_58;
  undefined1 local_48 [8];
  string output;
  char *test_result_local;
  char *pcStack_18;
  uint32_t digest_local;
  char *test_data_local;
  
  output.field_2._8_8_ = test_result;
  pcStack_18 = test_data;
  test_data_local = (char *)this;
  (anonymous_namespace)::digest_to_hex_abi_cxx11_
            ((string *)local_48,(_anonymous_namespace_ *)(ulong)digest,digest);
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(__s1,(char *)output.field_2._8_8_);
  if (iVar1 == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<(&local_68,(char (*) [10])"hash of \"");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&stack0xffffffffffffffe8);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [14])"\" incorrect:\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])"\t");
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_48);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])" returned\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])"\t");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char **)((long)&output.field_2 + 8));
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [13])" is correct\n");
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    testing::AssertionResult::~AssertionResult(&local_68);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_48);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

::testing::AssertionResult IsEqual(const char *test_data,
                                   uint32_t digest,
                                   const char *test_result) {
  std::string output = digest_to_hex(digest);
  if (strcmp(output.c_str(), test_result) == 0) {
    return ::testing::AssertionSuccess();
  } else {
    return ::testing::AssertionFailure()
        << "hash of \"" << test_data << "\" incorrect:\n"
        << "\t" << output << " returned\n"
        << "\t" << test_result << " is correct\n";
  }
}